

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_miniscript_thresh(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  bool bVar2;
  bool bVar3;
  int32_t iVar4;
  uint uVar5;
  int iVar6;
  uint local_44;
  int local_40;
  uint32_t num_s;
  uint32_t args;
  _Bool all_m;
  uint uStack_34;
  _Bool all_e;
  uint32_t k;
  uint32_t count;
  miniscript_node_t *child;
  miniscript_node_t *top;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  uStack_34 = 0;
  bVar2 = true;
  bVar3 = true;
  local_40 = 0;
  local_44 = 0;
  iVar4 = get_child_list_count(node);
  if (iVar4 < 4) {
    node_local._4_4_ = -2;
  }
  else {
    pmVar1 = node->child;
    if (((pmVar1->info == (miniscript_item_t *)0x0) && (pmVar1->kind == 8)) && (-1 < pmVar1->number)
       ) {
      uVar5 = (uint)pmVar1->number;
      if (uVar5 == 0) {
        node_local._4_4_ = -2;
      }
      else {
        for (_k = pmVar1->next; _k != (miniscript_node_t *)0x0; _k = _k->next) {
          if (_k->info == (miniscript_item_t *)0x0) {
            return -2;
          }
          if (uStack_34 == 0) {
            if (((_k->type_properties ^ 0xffffffff) & 0x1801) != 0) {
              return -2;
            }
          }
          else if (((_k->type_properties ^ 0xffffffff) & 0x1808) != 0) {
            return -2;
          }
          if (((_k->type_properties ^ 0xffffffff) & 0x2000) != 0) {
            bVar2 = false;
          }
          if (((_k->type_properties ^ 0xffffffff) & 0x10000) != 0) {
            bVar3 = false;
          }
          if ((_k->type_properties & 0x8000) != 0) {
            local_44 = local_44 + 1;
          }
          if ((_k->type_properties & 0x100) != 0) {
            iVar6 = 1;
            if (((_k->type_properties ^ 0xffffffff) & 0x200) != 0) {
              iVar6 = 2;
            }
            local_40 = iVar6 + local_40;
          }
          uStack_34 = uStack_34 + 1;
        }
        if (uStack_34 < uVar5) {
          node_local._4_4_ = -2;
        }
        else {
          node->type_properties = 0x1801;
          if (local_40 == 0) {
            node->type_properties = node->type_properties | 0x100;
          }
          else if (local_40 == 1) {
            node->type_properties = node->type_properties | 0x200;
          }
          if ((bVar2) && (local_44 == uStack_34)) {
            node->type_properties = node->type_properties | 0x2000;
          }
          if (((bVar2) && (bVar3)) && (uStack_34 - uVar5 <= local_44)) {
            node->type_properties = node->type_properties | 0x10000;
          }
          if ((uStack_34 - uVar5) + 1 <= local_44) {
            node->type_properties = node->type_properties | 0x8000;
          }
          node_local._4_4_ = 0;
        }
      }
    }
    else {
      node_local._4_4_ = -2;
    }
  }
  return node_local._4_4_;
}

Assistant:

static int verify_miniscript_thresh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    struct miniscript_node_t *top = NULL;
    struct miniscript_node_t *child = NULL;
    uint32_t count = 0;
    uint32_t k = 0;
    bool all_e = true;
    bool all_m = true;
    uint32_t args = 0;
    uint32_t num_s = 0;
    (void)parent;

    if (get_child_list_count(node) < 4)
        return WALLY_EINVAL;

    top = node->child;
    if (top->info || (top->kind != DESCRIPTOR_KIND_NUMBER) || (top->number < 0))
        return WALLY_EINVAL;

    k = (uint32_t) top->number;
    if (k < 1)
        return WALLY_EINVAL;

    child = top->next;
    while (child) {
        if (!child->info)
            return WALLY_EINVAL;

        if (!count) {
            if (~(child->type_properties) & (MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U))
                return WALLY_EINVAL;
        } else if (~(child->type_properties) & (MINISCRIPT_TYPE_W | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U))
            return WALLY_EINVAL;

        if (~(child->type_properties) & MINISCRIPT_PROPERTY_E)
            all_e = false;
        if (~(child->type_properties) & MINISCRIPT_PROPERTY_M)
            all_m = false;
        if ((child->type_properties) & MINISCRIPT_PROPERTY_S)
            ++num_s;
        if ((child->type_properties) & MINISCRIPT_PROPERTY_Z)
            args += (~(child->type_properties) & MINISCRIPT_PROPERTY_O) ? 2 : 1;

        ++count;
        child = child->next;
    }

    if (k > count)
        return WALLY_EINVAL;

    node->type_properties = MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U;
    if (args == 0)
        node->type_properties |= MINISCRIPT_PROPERTY_Z;
    else if (args == 1)
        node->type_properties |= MINISCRIPT_PROPERTY_O;
    if (all_e && num_s == count)
        node->type_properties |= MINISCRIPT_PROPERTY_E;
    if (all_e && all_m && num_s >= count - k)
        node->type_properties |= MINISCRIPT_PROPERTY_M;
    if (num_s >= count - k + 1)
        node->type_properties |= MINISCRIPT_PROPERTY_S;

    return WALLY_OK;
}